

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O3

int VScaleDiffVectorArray_Serial(int nvec,realtype c,N_Vector *X,N_Vector *Y,N_Vector *Z)

{
  long lVar1;
  long lVar2;
  long lVar3;
  uint in_EAX;
  ulong uVar4;
  ulong uVar5;
  
  if (0 < nvec) {
    in_EAX = *(*X)->content;
    uVar5 = 0;
    do {
      if (0 < (int)in_EAX) {
        lVar1 = *(long *)((long)X[uVar5]->content + 8);
        lVar2 = *(long *)((long)Y[uVar5]->content + 8);
        lVar3 = *(long *)((long)Z[uVar5]->content + 8);
        uVar4 = 0;
        do {
          *(double *)(lVar3 + uVar4 * 8) =
               (*(double *)(lVar1 + uVar4 * 8) - *(double *)(lVar2 + uVar4 * 8)) * c;
          uVar4 = uVar4 + 1;
        } while (in_EAX != uVar4);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)nvec);
  }
  return in_EAX;
}

Assistant:

static int VScaleDiffVectorArray_Serial(int nvec, realtype c, N_Vector* X, N_Vector* Y, N_Vector* Z)
{
  int          i;
  sunindextype j, N;
  realtype*    xd=NULL;
  realtype*    yd=NULL;
  realtype*    zd=NULL;

  N = NV_LENGTH_S(X[0]);

  for (i=0; i<nvec; i++) {
    xd = NV_DATA_S(X[i]);
    yd = NV_DATA_S(Y[i]);
    zd = NV_DATA_S(Z[i]);
    for (j=0; j<N; j++)
      zd[j] = c * (xd[j] - yd[j]);
  }

  return(0);
}